

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutFirstCard_Test::
~StockPileWithCardsTest_tryPullOutFirstCard_Test
          (StockPileWithCardsTest_tryPullOutFirstCard_Test *this)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_StockPileWithCardsTest).super_EmptyStockPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileWithCardsTest_003319d8;
  pCVar1 = (this->super_StockPileWithCardsTest).pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1,(long)(this->super_StockPileWithCardsTest).pileCards.
                                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pCVar1);
  }
  (this->super_StockPileWithCardsTest).super_EmptyStockPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyStockPileTest_00331918;
  this_00 = (this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
            super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutFirstCard) {
    const auto firstCard = pileCards.front();
    pileCards.erase(pileCards.begin());

    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), firstCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), std::nullopt);
}